

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void wiznet(char *string,CHAR_DATA *ch,OBJ_DATA *obj,long flag,long flag_skip,int min_level)

{
  ulong uVar1;
  CHAR_DATA *ch_00;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  DESCRIPTOR_DATA *pDVar8;
  double dVar9;
  char str [4608];
  char local_1238 [4616];
  
  if (descriptor_list != (DESCRIPTOR_DATA *)0x0) {
    uVar4 = flag + 0x1f;
    if (-1 < flag) {
      uVar4 = flag;
    }
    uVar5 = flag_skip + 0x1f;
    if (-1 < flag_skip) {
      uVar5 = flag_skip;
    }
    pDVar8 = descriptor_list;
    do {
      if ((((((pDVar8->connected == 0) && (pDVar8->character != (CHAR_DATA *)0x0)) &&
            (bVar2 = is_immortal(pDVar8->character), bVar2)) &&
           ((pDVar8->character->wiznet[0] & 1) != 0)) &&
          (((flag == 0 ||
            (uVar1 = pDVar8->character->wiznet[(int)(uVar4 >> 5)],
            dVar9 = exp2((double)(flag % 0x20)), (uVar1 & (long)dVar9) != 0)) &&
           ((flag_skip == 0 ||
            (uVar1 = pDVar8->character->wiznet[(int)(uVar5 >> 5)],
            dVar9 = exp2((double)(flag_skip % 0x20)), (uVar1 & (long)dVar9) == 0)))))) &&
         ((iVar3 = get_trust(pDVar8->character), min_level <= iVar3 &&
          (ch_00 = pDVar8->character, ch_00 != ch)))) {
        if ((ch_00->wiznet[0] & 0x40000) != 0) {
          send_to_char("--> ",ch_00);
        }
        pcVar6 = get_char_color(pDVar8->character,"wiznet");
        pcVar7 = END_COLOR(pDVar8->character);
        sprintf(local_1238,"%s%s%s",pcVar6,string,pcVar7);
        act_new(local_1238,pDVar8->character,obj,ch,3,0);
      }
      pDVar8 = pDVar8->next;
    } while (pDVar8 != (DESCRIPTOR_DATA *)0x0);
  }
  return;
}

Assistant:

void wiznet(char *string, CHAR_DATA *ch, OBJ_DATA *obj, long flag, long flag_skip, int min_level)
{
	char str[MAX_STRING_LENGTH];

	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& is_immortal(d->character)
			&& IS_SET(d->character->wiznet, WIZ_ON)
			&& (!flag || IS_SET(d->character->wiznet, flag))
			&& (!flag_skip || !IS_SET(d->character->wiznet, flag_skip))
			&& get_trust(d->character) >= min_level
			&& d->character != ch)
		{
			if (IS_SET(d->character->wiznet, WIZ_PREFIX))
				send_to_char("--> ", d->character);

			sprintf(str, "%s%s%s", get_char_color(d->character, "wiznet"), string, END_COLOR(d->character));
			act_new(str, d->character, obj, ch, TO_CHAR, POS_DEAD);
		}
	}
}